

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_align.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::align_ev2v_deg<2,long>(Omega_h *this,Read<int> *ev2v,Read<signed_char> *codes)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<long> local_130;
  undefined1 local_120 [8];
  type f;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  Write<int> ev2v_w;
  LO ne;
  Read<signed_char> *codes_local;
  Read<int> *ev2v_local;
  int local_68;
  LO local_50;
  ulong local_28;
  ulong local_10;
  
  if (((ulong)(ev2v->write_).shared_alloc_.alloc & 1) == 0) {
    local_28 = ((ev2v->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_28 = (ulong)(ev2v->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(codes->write_).shared_alloc_.alloc & 1) == 0) {
    local_68 = (int)((codes->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_68 = (int)((ulong)(codes->write_).shared_alloc_.alloc >> 3);
  }
  if ((int)(local_28 >> 3) == local_68 * 2) {
    if (((ulong)(codes->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = (LO)((codes->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (LO)((ulong)(codes->write_).shared_alloc_.alloc >> 3);
    }
    ev2v_w.shared_alloc_.direct_ptr._4_4_ = local_50;
    if (((ulong)(ev2v->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = ((ev2v->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (ulong)(ev2v->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"",&local_d9);
    Write<long>::Write((Write<long> *)local_b8,(LO)(local_10 >> 3),(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    Read<signed_char>::Read((Read<signed_char> *)local_120,codes);
    Read<long>::Read((Read<long> *)&f.codes.write_.shared_alloc_.direct_ptr,ev2v);
    Write<long>::Write((Write<long> *)&f.ev2v.write_.shared_alloc_.direct_ptr,(Write<int> *)local_b8
                      );
    parallel_for<Omega_h::align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (ev2v_w.shared_alloc_.direct_ptr._4_4_,(type *)local_120,"align_ev2v");
    Write<long>::Write(&local_130,(Write<int> *)local_b8);
    Read<long>::Read((Read<long> *)this,&local_130);
    Write<long>::~Write(&local_130);
    align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_120);
    Write<long>::~Write((Write<long> *)local_b8);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ev2v.size() == codes.size() * deg",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_align.cpp"
       ,9);
}

Assistant:

Read<T> align_ev2v_deg(Read<T> ev2v, Read<I8> codes) {
  OMEGA_H_CHECK(ev2v.size() == codes.size() * deg);
  auto ne = codes.size();
  Write<T> ev2v_w(ev2v.size());
  auto f = OMEGA_H_LAMBDA(LO e) {
    align_adj<deg>(codes[e], ev2v, e * deg, ev2v_w, e * deg);
  };
  parallel_for(ne, f, "align_ev2v");
  return ev2v_w;
}